

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

bool P_TeleportMove(AActor *thing,DVector3 *pos,bool telefrag,bool modifyactor)

{
  double dVar1;
  sector_t *psVar2;
  DAngle angle;
  bool bVar3;
  AActor *pAVar4;
  bool bVar5;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  FName local_3ac;
  undefined1 local_3a8 [8];
  sector_t *local_3a0;
  sector_t_conflict *local_398;
  DObject *local_390;
  undefined8 local_388;
  FPortalGroupArray grouplist;
  CheckResult cres2;
  undefined1 local_330 [72];
  Angle local_2e8;
  FTextureID local_2e0;
  sector_t *local_2d8;
  undefined2 local_2d0;
  TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_> local_2b8;
  CheckResult cres;
  FMultiBlockLinesIterator mit;
  FMultiBlockThingsIterator mit2;
  
  FCheckPosition::FCheckPosition((FCheckPosition *)local_330,false);
  psVar2 = thing->Sector;
  local_330._24_8_ = pos->Z;
  local_330._8_8_ = pos->X;
  local_330._16_8_ = pos->Y;
  local_2d0._0_1_ = false;
  local_2d0._1_1_ = false;
  local_330._0_8_ = thing;
  P_GetFloorCeilingZ((FCheckPosition *)local_330,0);
  TArray<spechit_t,_spechit_t>::Clear(&spechit);
  if ((((thing->flags2).Value & 0x40000) != 0) || ((level.flags._1_1_ & 4) != 0 || telefrag)) {
    bVar5 = ((thing->flags7).Value & 2) == 0;
  }
  else {
    bVar5 = false;
  }
  local_390 = (DObject *)(thing->__Pos).Z;
  (thing->__Pos).Z = pos->Z;
  mit2.checklist = (FPortalGroupArray *)pos->X;
  mit2.checkpoint.X = pos->Y;
  local_398 = P_PointInSector((DVector2 *)&mit2);
  grouplist.data.Array = (unsigned_short *)0x0;
  grouplist.data.Most = 0;
  grouplist.data.Count = 0;
  grouplist.method = 1;
  grouplist.varused = '\0';
  grouplist.inited = false;
  local_3a0 = psVar2;
  FMultiBlockLinesIterator::FMultiBlockLinesIterator
            (&mit,&grouplist,pos->X,pos->Y,pos->Z,thing->Height,thing->radius,(sector_t *)local_398)
  ;
  while (bVar3 = FMultiBlockLinesIterator::Next(&mit,&cres), bVar3) {
    PIT_FindFloorCeiling(&mit,&cres,&mit.bbox,(FCheckPosition *)local_330,0);
  }
  (thing->__Pos).Z = (double)local_390;
  if (local_2d0._0_1_ == true) {
    local_330._56_8_ = local_330._40_8_;
  }
  FMultiBlockThingsIterator::FMultiBlockThingsIterator
            (&mit2,&grouplist,pos->X,pos->Y,pos->Z,thing->Height,thing->radius,false,
             (sector_t *)local_398);
LAB_00412b97:
  do {
    bVar3 = FMultiBlockThingsIterator::Next(&mit2,&cres2);
    pAVar4 = cres2.thing;
    if (!bVar3) {
      if (modifyactor) {
        AActor::SetOrigin(thing,pos,false);
        thing->floorz = (double)local_330._40_8_;
        thing->ceilingz = (double)local_330._48_8_;
        thing->floorsector = (sector_t *)local_2e8.Degrees;
        thing->floorpic = (FTextureID)local_330._64_4_;
        thing->floorterrain = local_330._68_4_;
        thing->ceilingsector = local_2d8;
        (thing->ceilingpic).texnum = local_2e0.texnum;
        thing->dropoffz = (double)local_330._56_8_;
        thing->BlockingLine = (line_t *)0x0;
        if (((thing->flags2).Value & 0x20) != 0) {
          AActor::AdjustFloorClip(thing);
        }
        pAVar4 = GC::ReadBarrier<AActor>((AActor **)(&DAT_017dc0f8 + (long)consoleplayer * 0x54));
        if (pAVar4 == thing) {
          R_ResetViewInterpolation();
        }
        if ((i_compatflags2 & 0x20U) == 0 && ((thing->flags6).Value & 0x10000000) == 0) {
          AActor::CheckSectorTransition(thing,local_3a0);
        }
      }
LAB_00412e17:
      TArray<FBlockThingsIterator::HashEntry,_FBlockThingsIterator::HashEntry>::~TArray
                (&mit2.blockIterator.DynHash);
      TArray<unsigned_short,_unsigned_short>::~TArray(&grouplist.data);
      TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_>::~TMap(&local_2b8);
      return !bVar3;
    }
  } while ((((cres2.thing == thing) || ((((cres2.thing)->flags).Value & 4) == 0)) ||
           (angle.Degrees = (cres2.thing)->radius + *(double *)(local_330._0_8_ + 0x178),
           angle.Degrees <= ABS(((cres2.thing)->__Pos).X - cres2.Position.X))) ||
          ((angle.Degrees <= ABS(((cres2.thing)->__Pos).Y - cres2.Position.Y) ||
           (((((cres2.thing)->flags2).Value | ((ActorFlags2 *)(local_330._0_8_ + 0x1c0))->Value) >>
             0x14 & 1) != 0))));
  if ((((ActorFlags6 *)(local_330._0_8_ + 0x1d0))->Value & 2) != 0) {
    AActor::GetSpecies((AActor *)(local_3a8 + 4));
    AActor::GetSpecies((AActor *)local_3a8);
    angle.Degrees = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    if (local_3a8._4_4_ == local_3a8._0_4_) goto LAB_00412b97;
  }
  if (((((thing->flags2).Value & 0x1000) != 0) || (((pAVar4->flags4).Value & 0x80) != 0)) &&
     ((((byte)i_compatflags & 0x10) == 0 &&
      ((((thing->flags3).Value & (pAVar4->flags3).Value) >> 8 & 1) == 0)))) {
    dVar1 = (pAVar4->__Pos).Z;
    if ((pAVar4->Height + dVar1 < pos->Z) ||
       (angle.Degrees = pos->Z + thing->Height, angle.Degrees < dVar1)) goto LAB_00412b97;
  }
  if (((!bVar5) || (((pAVar4->flags6).Value & 0x100) != 0)) && (((pAVar4->flags7).Value & 4) == 0))
  goto LAB_00412e17;
  if ((thing->player == (player_t *)0x0) || ((thing->player->cheats & 0x2000) == 0)) {
    local_3ac.Index = 0xc1;
    local_388._0_4_ = 0;
    local_388._4_4_ = 0;
    P_DamageMobj(pAVar4,thing,thing,1000000,&local_3ac,4,angle);
  }
  goto LAB_00412b97;
}

Assistant:

bool	P_TeleportMove(AActor* thing, const DVector3 &pos, bool telefrag, bool modifyactor) 
{
	FCheckPosition tmf;
	sector_t *oldsec = thing->Sector;

	// kill anything occupying the position


	// The base floor/ceiling is from the subsector that contains the point.
	// Any contacted lines the step closer together will adjust them.
	tmf.thing = thing;
	tmf.pos = pos;
	tmf.touchmidtex = false;
	tmf.abovemidtex = false;
	P_GetFloorCeilingZ(tmf, 0);

	spechit.Clear();	// this is needed so that no more specials get activated after crossing a teleporter.

	bool StompAlwaysFrags = ((thing->flags2 & MF2_TELESTOMP) || (level.flags & LEVEL_MONSTERSTELEFRAG) || telefrag) && !(thing->flags7 & MF7_NOTELESTOMP);

	// P_LineOpening requires the thing's z to be the destination z in order to work.
	double savedz = thing->Z();
	thing->SetZ(pos.Z);
	sector_t *sector = P_PointInSector(pos);

	FPortalGroupArray grouplist;
	FMultiBlockLinesIterator mit(grouplist, pos.X, pos.Y, pos.Z, thing->Height, thing->radius, sector);
	FMultiBlockLinesIterator::CheckResult cres;

	while (mit.Next(&cres))
	{
		PIT_FindFloorCeiling(mit, cres, mit.Box(), tmf, 0);
	}
	thing->SetZ(savedz);

	if (tmf.touchmidtex) tmf.dropoffz = tmf.floorz;

	FMultiBlockThingsIterator mit2(grouplist, pos.X, pos.Y, pos.Z, thing->Height, thing->radius, false, sector);
	FMultiBlockThingsIterator::CheckResult cres2;

	while (mit2.Next(&cres2))
	{
		AActor *th = cres2.thing;

		if (!(th->flags & MF_SHOOTABLE))
			continue;

		// don't clip against self
		if (th == thing)
			continue;

		double blockdist = th->radius + tmf.thing->radius;
		if (fabs(th->X() - cres2.Position.X) >= blockdist || fabs(th->Y() - cres2.Position.Y) >= blockdist)
			continue;

		if ((th->flags2 | tmf.thing->flags2) & MF2_THRUACTORS)
			continue;

		if (tmf.thing->flags6 & MF6_THRUSPECIES && tmf.thing->GetSpecies() == th->GetSpecies())
			continue;

		// [RH] Z-Check
		// But not if not MF2_PASSMOBJ or MF3_DONTOVERLAP are set!
		// Otherwise those things would get stuck inside each other.
		if ((thing->flags2 & MF2_PASSMOBJ || th->flags4 & MF4_ACTLIKEBRIDGE) && !(i_compatflags & COMPATF_NO_PASSMOBJ))
		{
			if (!(th->flags3 & thing->flags3 & MF3_DONTOVERLAP))
			{
				if (pos.Z > th->Top() ||	// overhead
					pos.Z + thing->Height < th->Z())	// underneath
					continue;
			}
		}

		// monsters don't stomp things except on boss level
		// [RH] Some Heretic/Hexen monsters can telestomp
		// ... and some items can never be telefragged while others will be telefragged by everything that teleports upon them.
		if ((StompAlwaysFrags && !(th->flags6 & MF6_NOTELEFRAG)) || (th->flags7 & MF7_ALWAYSTELEFRAG))
		{
			// Don't actually damage if predicting a teleport
			if (thing->player == NULL || !(thing->player->cheats & CF_PREDICTING))
				P_DamageMobj(th, thing, thing, TELEFRAG_DAMAGE, NAME_Telefrag, DMG_THRUSTLESS);
			continue;
		}
		return false;
	}

	if (modifyactor)
	{
		// the move is ok, so link the thing into its new position
		thing->SetOrigin(pos, false);
		thing->floorz = tmf.floorz;
		thing->ceilingz = tmf.ceilingz;
		thing->floorsector = tmf.floorsector;
		thing->floorpic = tmf.floorpic;
		thing->floorterrain = tmf.floorterrain;
		thing->ceilingsector = tmf.ceilingsector;
		thing->ceilingpic = tmf.ceilingpic;
		thing->dropoffz = tmf.dropoffz;        // killough 11/98
		thing->BlockingLine = NULL;

		if (thing->flags2 & MF2_FLOORCLIP)
		{
			thing->AdjustFloorClip();
		}

		if (thing == players[consoleplayer].camera)
		{
			R_ResetViewInterpolation();
		}

		// If this teleport was caused by a move, P_TryMove() will handle the
		// sector transition messages better than we can here.
		// This needs to be compatibility optioned because some older maps exploited this missing feature.
		if (!(thing->flags6 & MF6_INTRYMOVE) && !(i_compatflags2 & COMPATF2_TELEPORT))
		{
			thing->CheckSectorTransition(oldsec);
		}
	}

	return true;
}